

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall
cppforth::Forth::MoveFileHandle
          (Forth *this,Cell handler,
          shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *fileHandle_,
          string *function,errorCodes ec)

{
  Cell CVar1;
  pointer pFVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pFVar5;
  undefined8 uVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pFVar5 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = pFVar5 == pFVar2;
  if (!bVar7) {
    CVar1 = pFVar5->FILE;
    while (CVar1 != handler) {
      pFVar5 = pFVar5 + 1;
      bVar7 = pFVar5 == pFVar2;
      if (bVar7) goto LAB_0011e940;
      CVar1 = pFVar5->FILE;
    }
    peVar3 = (pFVar5->fileObject).
             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (pFVar5->fileObject).
    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (fileHandle_->
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    (fileHandle_->
    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar3;
    p_Var4 = (fileHandle_->
             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    (fileHandle_->
    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi =
         (pFVar5->fileObject).
         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (pFVar5->fileObject).
    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var4;
    if (!bVar7) {
      return;
    }
  }
LAB_0011e940:
  std::operator+(&local_38,function,": wrong file handler access");
  throwMessage(this,&local_38,ec);
  std::__cxx11::string::~string((string *)&local_38);
  uVar6 = __cxa_rethrow();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void  MoveFileHandle(Cell handler,std::shared_ptr<std::fstream>& fileHandle_,  const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler) {
			std::swap((*it).fileObject, fileHandle_);
			return;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}